

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void unpunish(void)

{
  obj *obj;
  obj *savechain;
  
  obj = uchain;
  obj_extract_self(uchain);
  newsym((int)uchain->ox,(int)uchain->oy);
  setworn((obj *)0x0,0x400000);
  dealloc_obj(obj);
  uball->spe = '\0';
  setworn((obj *)0x0,0x200000);
  return;
}

Assistant:

void unpunish(void)
{	    /* remove the ball and chain */
	struct obj *savechain = uchain;

	obj_extract_self(uchain);
	newsym(uchain->ox,uchain->oy);
	setworn(NULL, W_CHAIN);
	dealloc_obj(savechain);
	uball->spe = 0;
	setworn(NULL, W_BALL);
}